

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O3

void refresh_stock(game_event_type type,game_event_data *unused,void *user)

{
  void *data;
  
  store_stock_list(*(store **)((long)user + 0xb0),*(object ***)((long)user + 0xb8),
                   (uint)z_info->store_inven_max);
  store_display_recalc((store_context *)user);
  data = menu_priv((menu_conflict *)user);
  menu_setpriv((menu_conflict *)user,(uint)*(byte *)(*(long *)((long)data + 0xb0) + 0x30),data);
  store_redraw((store_context *)user);
  return;
}

Assistant:

static void refresh_stock(game_event_type type, game_event_data *unused, void *user)
{
	struct store_context *ctx = user;
	struct menu *menu = &ctx->menu;

	store_stock_list(ctx->store, ctx->list, z_info->store_inven_max);

	/* Display the store */
	store_display_recalc(ctx);
	store_menu_recalc(menu);
	store_redraw(ctx);
}